

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::logStackBackTraceOtherThreads(SimpleLoggerMgr *this)

{
  unsigned_long uVar1;
  byte bVar2;
  bool bVar3;
  pthread_t pVar4;
  pthread_t pVar5;
  reference puVar6;
  __int_type _Var7;
  ostream *poVar8;
  pthread_t *ppVar9;
  long in_RDI;
  string msg_1;
  sigset_t _mask;
  sigaction _action;
  pthread_t tid;
  uint64_t _tid;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  string msg;
  lock_guard<std::mutex> l;
  uint64_t exp;
  uint64_t my_tid;
  bool got_other_stacks;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  memory_order in_stack_fffffffffffffc34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  allocator *paVar10;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  pthread_t in_stack_fffffffffffffc98;
  int level;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  allocator local_251;
  string local_250 [32];
  sigset_t local_230;
  sigaction local_1b0;
  unsigned_long local_118;
  unsigned_long local_110;
  _Node_iterator_base<unsigned_long,_false> local_108;
  _Node_iterator_base<unsigned_long,_false> local_100;
  long local_f8;
  string local_f0 [32];
  string local_d0 [55];
  allocator local_99;
  string local_98 [40];
  pthread_t local_70;
  pthread_t local_68;
  byte local_59;
  undefined4 local_4c;
  pthread_t local_48;
  pthread_t *local_40;
  pthread_t *local_38;
  bool local_29;
  pthread_t local_28;
  memory_order local_20;
  undefined4 local_1c;
  pthread_t local_18;
  pthread_t *local_10;
  pthread_t *local_8;
  
  level = (int)(in_stack_fffffffffffffc98 >> 0x20);
  local_59 = 0;
  if ((*(byte *)(in_RDI + 0x428) & 1) == 0) {
    pVar4 = pthread_self();
    local_70 = 0;
    ppVar9 = (pthread_t *)(in_RDI + 0x200);
    local_4c = 5;
    local_68 = pVar4;
    local_48 = pVar4;
    local_40 = &local_70;
    local_38 = ppVar9;
    local_20 = std::__cmpexch_failure_order(in_stack_fffffffffffffc34);
    local_1c = 5;
    switch(0x19b629) {
    default:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      else {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      break;
    case 2:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      else {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      break;
    case 3:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pVar5 = *ppVar9;
        in_stack_fffffffffffffca7 = local_70 == pVar5;
        if ((bool)in_stack_fffffffffffffca7) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffca7;
        if (!(bool)in_stack_fffffffffffffca7) {
          local_70 = pVar5;
        }
      }
      else {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      break;
    case 4:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pVar5 = *ppVar9;
        local_29 = local_70 == pVar5;
        if (local_29) {
          *ppVar9 = pVar4;
          pVar5 = local_70;
        }
        UNLOCK();
        if (!local_29) {
          local_70 = pVar5;
        }
      }
      else {
        LOCK();
        in_stack_fffffffffffffc98 = *ppVar9;
        in_stack_fffffffffffffc97 = local_70 == in_stack_fffffffffffffc98;
        if ((bool)in_stack_fffffffffffffc97) {
          *ppVar9 = pVar4;
          in_stack_fffffffffffffc98 = local_70;
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffc97;
        if (!(bool)in_stack_fffffffffffffc97) {
          local_70 = in_stack_fffffffffffffc98;
        }
      }
    }
    if (local_29 == false) {
      return;
    }
    local_28 = pVar4;
    local_18 = pVar4;
    local_10 = &local_70;
    local_8 = ppVar9;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (mutex_type *)in_stack_fffffffffffffc28);
    paVar10 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"captured ",paVar10);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)0x19bc64);
    std::__cxx11::to_string((unsigned_long)paVar10);
    std::operator+(in_stack_fffffffffffffc38,
                   (char *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    std::__cxx11::string::operator+=(local_98,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    flushAllLoggers((SimpleLoggerMgr *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0)
                    ,(int)(in_stack_fffffffffffffc98 >> 0x20),
                    (string *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) != 0) {
      poVar8 = std::operator<<((ostream *)(in_RDI + 0x228),local_98);
      std::operator<<(poVar8,"\n\n");
    }
    local_f8 = in_RDI + 0x88;
    local_100._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::begin(in_stack_fffffffffffffc28);
    local_108._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(in_stack_fffffffffffffc28);
    while( true ) {
      bVar3 = std::__detail::operator!=(&local_100,&local_108);
      level = (int)(in_stack_fffffffffffffc98 >> 0x20);
      if (!bVar3) break;
      puVar6 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                         ((_Node_iterator<unsigned_long,_true,_false> *)0x19be36);
      uVar1 = *puVar6;
      local_118 = uVar1;
      local_110 = uVar1;
      _Var7 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffc38);
      if (uVar1 != _Var7) {
        sigfillset(&local_1b0.sa_mask);
        local_1b0.sa_flags = 4;
        local_1b0.__sigaction_handler.sa_handler = handleStackTrace;
        sigaction(0xc,&local_1b0,(sigaction *)0x0);
        pthread_kill(local_118,0xc);
        sigfillset(&local_230);
        sigdelset(&local_230,0xc);
        sigsuspend(&local_230);
      }
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                ((_Node_iterator<unsigned_long,_true,_false> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    }
    std::__cxx11::string::operator=(local_98,"got all stack traces, now flushing them");
    flushAllLoggers((SimpleLoggerMgr *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0)
                    ,level,(string *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    local_59 = 1;
    std::__cxx11::string::~string(local_98);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19bf6a);
  }
  if ((local_59 & 1) == 0) {
    paVar10 = &local_251;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_250,"will not explore other threads (disabled by user)",paVar10);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    flushAllLoggers((SimpleLoggerMgr *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0)
                    ,level,(string *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) != 0) {
      poVar8 = std::operator<<((ostream *)(in_RDI + 0x228),local_250);
      std::operator<<(poVar8,"\n\n");
    }
    std::__cxx11::string::~string(local_250);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::logStackBackTraceOtherThreads() {
    bool got_other_stacks = false;
#ifdef __linux__
    if (!crashDumpOriginOnly) {
        // Not support non-Linux platform.
        uint64_t my_tid = pthread_self();
        uint64_t exp = 0;
        if (!crashOriginThread.compare_exchange_strong(exp, my_tid)) {
            // Other thread is already working on it, stop here.
            return;
        }

        std::lock_guard<std::mutex> l(activeThreadsLock);
        std::string msg = "captured ";
        msg += std::to_string(activeThreads.size()) + " active threads";
        flushAllLoggers(2, msg);
        if (crashDumpFile.is_open()) crashDumpFile << msg << "\n\n";

        for (uint64_t _tid: activeThreads) {
            pthread_t tid = (pthread_t)_tid;
            if (_tid == crashOriginThread) continue;

            struct sigaction _action;
            sigfillset(&_action.sa_mask);
            _action.sa_flags = SA_SIGINFO;
            _action.sa_sigaction = SimpleLoggerMgr::handleStackTrace;
            sigaction(SIGUSR2, &_action, NULL);

            pthread_kill(tid, SIGUSR2);

            sigset_t _mask;
            sigfillset(&_mask);
            sigdelset(&_mask, SIGUSR2);
            sigsuspend(&_mask);
        }

        msg = "got all stack traces, now flushing them";
        flushAllLoggers(2, msg);

        got_other_stacks = true;
    }
#endif

    if (!got_other_stacks) {
        std::string msg = "will not explore other threads (disabled by user)";
        flushAllLoggers(2, msg);
        if (crashDumpFile.is_open()) {
            crashDumpFile << msg << "\n\n";
        }
    }
}